

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

char * __thiscall
MemoryLeakDetector::reallocateMemoryAndLeakInformation
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,char *memory,size_t size,
          char *file,size_t line,bool allocatNodesSeperately)

{
  char *memory_00;
  MemoryLeakDetectorNode *node_00;
  MemoryLeakDetectorNode *node;
  char *new_memory;
  bool allocatNodesSeperately_local;
  size_t line_local;
  char *file_local;
  size_t size_local;
  char *memory_local;
  TestMemoryAllocator *allocator_local;
  MemoryLeakDetector *this_local;
  
  memory_00 = reallocateMemoryWithAccountingInformation
                        (this,allocator,memory,size,file,line,allocatNodesSeperately);
  if (memory_00 == (char *)0x0) {
    this_local = (MemoryLeakDetector *)0x0;
  }
  else {
    node_00 = createMemoryLeakAccountingInformation
                        (this,allocator,size,memory_00,allocatNodesSeperately);
    storeLeakInformation(this,node_00,memory_00,size,allocator,file,line);
    this_local = (MemoryLeakDetector *)node_00->memory_;
  }
  return (char *)this_local;
}

Assistant:

char* MemoryLeakDetector::reallocateMemoryAndLeakInformation(TestMemoryAllocator* allocator, char* memory, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
    char* new_memory = reallocateMemoryWithAccountingInformation(allocator, memory, size, file, line, allocatNodesSeperately);
    if (new_memory == NULLPTR) return NULLPTR;

    MemoryLeakDetectorNode *node = createMemoryLeakAccountingInformation(allocator, size, new_memory, allocatNodesSeperately);
    storeLeakInformation(node, new_memory, size, allocator, file, line);
    return node->memory_;
}